

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_utf_encode(nk_rune u,char *c,int clen)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint local_1c;
  
  local_1c = u;
  iVar1 = nk_utf_validate(&local_1c,0);
  iVar3 = 0;
  if (((iVar1 < 5) && (iVar3 = 0, iVar1 <= clen)) && (iVar1 != 0)) {
    lVar2 = (long)iVar1;
    lVar4 = lVar2;
    while (lVar4 = lVar4 + -1, lVar4 != 0) {
      c[lVar4] = (byte)local_1c & 0x3f | 0x80;
      local_1c = local_1c >> 6;
    }
    *c = (byte)local_1c & ~nk_utfmask[lVar2] | nk_utfbyte[lVar2];
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

NK_API int
nk_utf_encode(nk_rune u, char *c, int clen)
{
    int len, i;
    len = nk_utf_validate(&u, 0);
    if (clen < len || !len || len > NK_UTF_SIZE)
        return 0;

    for (i = len - 1; i != 0; --i) {
        c[i] = nk_utf_encode_byte(u, 0);
        u >>= 6;
    }
    c[0] = nk_utf_encode_byte(u, len);
    return len;
}